

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_calculate_minimum_redundancy(uint64_t *freq,uint64_t *syms,int64_t n)

{
  uint64_t *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  if (n != 0) {
    if (n != 1) {
      lVar8 = 2;
      uVar9 = 0;
      freq[*syms] = freq[*syms] + freq[syms[1]];
      lVar2 = n + -1;
      uVar3 = 1;
      do {
        if (lVar2 <= (long)uVar3) {
          freq[syms[n + -2]] = 0;
          for (lVar8 = n + -3; -1 < lVar8; lVar8 = lVar8 + -1) {
            freq[syms[lVar8]] = freq[syms[freq[syms[lVar8]]]] + 1;
          }
          uVar6 = 0;
          lVar8 = 1;
          lVar4 = n + -2;
          while (lVar8 != 0) {
            lVar15 = -1;
            if (lVar4 < -1) {
              lVar15 = lVar4;
            }
            lVar7 = 0;
            lVar11 = lVar4 - lVar15;
            while ((lVar5 = lVar15, lVar12 = lVar11, lVar15 != lVar4 &&
                   (lVar5 = lVar4, lVar12 = lVar7, freq[syms[lVar4]] == uVar6))) {
              lVar7 = lVar7 + 1;
              lVar4 = lVar4 + -1;
            }
            for (; lVar12 < lVar8; lVar8 = lVar8 + -1) {
              puVar1 = syms + lVar2;
              lVar2 = lVar2 + -1;
              freq[*puVar1] = uVar6;
            }
            uVar6 = uVar6 + 1;
            lVar4 = lVar5;
            lVar8 = lVar12 * 2;
          }
          return;
        }
        if ((lVar8 < n) && (uVar10 = freq[syms[lVar8]], uVar10 <= freq[syms[uVar9]])) {
          lVar8 = lVar8 + 1;
          uVar14 = uVar9;
          uVar13 = uVar3;
        }
        else {
          freq[syms[uVar3]] = freq[syms[uVar9]];
          uVar14 = uVar9 + 1;
          uVar10 = uVar3;
          uVar13 = uVar9;
        }
        uVar9 = uVar14;
        freq[syms[uVar13]] = uVar10;
        if (lVar8 < n) {
          if ((long)uVar9 < (long)uVar3) {
            uVar10 = freq[syms[uVar9]];
            uVar14 = freq[syms[lVar8]];
            if (uVar10 < uVar14) goto LAB_0012d134;
          }
          else {
            uVar14 = freq[syms[lVar8]];
          }
          lVar8 = lVar8 + 1;
          freq[syms[uVar3]] = freq[syms[uVar3]] + uVar14;
        }
        else {
          uVar10 = freq[syms[uVar9]];
LAB_0012d134:
          freq[syms[uVar3]] = freq[syms[uVar3]] + uVar10;
          puVar1 = syms + uVar9;
          uVar9 = uVar9 + 1;
          freq[*puVar1] = uVar3;
        }
        uVar3 = uVar3 + 1;
      } while( true );
    }
    freq[*syms] = 0;
  }
  return;
}

Assistant:

void shuff_calculate_minimum_redundancy(
    uint64_t freq[], uint64_t syms[], int64_t n)
{
    int64_t root; /* next root node to be used */
    int64_t leaf; /* next leaf to be used */
    int64_t next; /* next value to be assigned */
    int64_t avbl; /* number of available nodes */
    int64_t used; /* number of internal nodes */
    uint64_t dpth; /* current depth of leaves */

    /* check for pathological cases */
    if (n == 0) {
        return;
    }
    if (n == 1) {
        freq[syms[0]] = 0;
        return;
    }

    /* first pass, left to right, setting parent pointers */
    freq[syms[0]] += freq[syms[1]];
    root = 0;
    leaf = 2;
    for (next = 1; next < n - 1; next++) {
        /* select first item for a pairing */
        if (leaf >= n || freq[syms[root]] < freq[syms[leaf]]) {
            freq[syms[next]] = freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] = freq[syms[leaf++]];

        /* add on the second item */
        if (leaf >= n || (root < next && freq[syms[root]] < freq[syms[leaf]])) {
            freq[syms[next]] += freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] += freq[syms[leaf++]];
    }

    /* second pass, right to left, setting internal depths */
    freq[syms[n - 2]] = 0;
    for (next = n - 3; next >= 0; next--)
        freq[syms[next]] = freq[syms[freq[syms[next]]]] + 1;

    /* third pass, right to left, setting leaf depths */
    avbl = 1;
    used = dpth = 0;
    root = n - 2;
    next = n - 1;
    while (avbl > 0) {
        while (root >= 0 && freq[syms[root]] == dpth) {
            used++;
            root--;
        }
        while (avbl > used) {
            freq[syms[next--]] = dpth;
            avbl--;
        }
        avbl = 2 * used;
        dpth++;
        used = 0;
    }
}